

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImGui::ShadeVertsTransformPos
               (ImDrawList *draw_list,int vert_start_idx,int vert_end_idx,ImVec2 *pivot_in,
               float cos_a,float sin_a,ImVec2 *pivot_out)

{
  ImDrawVert *pIVar1;
  ImDrawVert *pIVar2;
  float fVar3;
  float fVar4;
  ImVec2 IVar5;
  
  if (vert_start_idx < vert_end_idx) {
    pIVar1 = (draw_list->VtxBuffer).Data;
    pIVar2 = pIVar1 + vert_start_idx;
    do {
      fVar3 = (pIVar2->pos).x - pivot_in->x;
      fVar4 = (pIVar2->pos).y - pivot_in->y;
      IVar5.x = (*pivot_out).x + fVar3 * cos_a + -fVar4 * sin_a;
      IVar5.y = (*pivot_out).y + fVar3 * sin_a + fVar4 * cos_a;
      pIVar2->pos = IVar5;
      pIVar2 = pIVar2 + 1;
    } while (pIVar2 < pIVar1 + vert_end_idx);
  }
  return;
}

Assistant:

void ImGui::ShadeVertsTransformPos(ImDrawList* draw_list, int vert_start_idx, int vert_end_idx, const ImVec2& pivot_in, float cos_a, float sin_a, const ImVec2& pivot_out)
{
    ImDrawVert* vert_start = draw_list->VtxBuffer.Data + vert_start_idx;
    ImDrawVert* vert_end = draw_list->VtxBuffer.Data + vert_end_idx;
    for (ImDrawVert* vertex = vert_start; vertex < vert_end; ++vertex)
        vertex->pos = ImRotate(vertex->pos- pivot_in, cos_a, sin_a) + pivot_out;
}